

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::ProcessGetData
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,atomic<bool> *interruptMsgProc)

{
  pointer *ppuVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  _Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
  *this_00;
  pointer ppCVar5;
  CBloomFilter *filter;
  CConnman *pCVar6;
  string msg_type;
  const_iterator __first;
  string msg_type_00;
  string msg_type_01;
  const_iterator __last;
  element_type *block;
  element_type *peVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  TxRelay *pTVar11;
  const_iterator cVar12;
  CBlockIndex *pCVar13;
  Chainstate *pCVar14;
  uint64_t nonce;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  Level LVar16;
  CBlockIndex *pCVar17;
  PairType *pair;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  PeerManagerImpl *pPVar19;
  CBlockIndex *in_stack_fffffffffffffc68;
  Peer *this_01;
  Mutex *mutexIn;
  deque<CInv,_std::allocator<CInv>_> *this_02;
  vector<CInv,_std::allocator<CInv>_> vNotFound;
  _Deque_iterator<CInv,_CInv_&,_CInv_*> local_318;
  GetDataMsg local_2ec;
  vector<CInv,_std::allocator<CInv>_> vInv;
  shared_ptr<const_CBlock> pblock;
  FlatFilePos local_2b0;
  undefined1 local_2a8 [16];
  shared_ptr<const_CBlockHeaderAndShortTxIDs> a_recent_compact_block;
  shared_ptr<const_CBlock> a_recent_block;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock57;
  string local_268;
  string local_248;
  string local_228;
  Span<unsigned_char> local_208;
  uchar local_1f8;
  undefined7 uStack_1f7;
  TransactionSerParams maybe_with_witness;
  undefined1 auStack_1e7 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [10];
  TxMempoolInfo txinfo;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [6];
  pointer local_90;
  pointer local_88;
  CTransactionRef tx;
  undefined1 local_68 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  pointer pCStack_40;
  TxMempoolInfo *pTVar18;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar11 = Peer::GetTxRelay(peer);
  this_02 = &peer->m_getdata_requests;
  local_318._M_cur =
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_318._M_first =
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_318._M_last =
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_318._M_node =
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mutexIn = &this->m_most_recent_block_mutex;
  while ((local_318._M_cur !=
          (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur &&
         (bVar8 = CInv::IsGenTxMsg(local_318._M_cur), bVar8))) {
    if (((interruptMsgProc->_M_base)._M_i & 1U) != 0) goto LAB_001b0a8b;
    if (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0) break;
    std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator++((_Self *)&txinfo,&local_318,0);
    peVar7 = txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pTVar11 != (TxRelay *)0x0) {
      ToGenTxid((GenTxid *)&maybe_with_witness,
                (CInv *)txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
      CTxMemPool::info_for_relay
                (&txinfo,this->m_mempool,(GenTxid *)&maybe_with_witness,pTVar11->m_last_inv_sequence
                );
      if (txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&block_data,mutexIn,
                   "m_most_recent_block_mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                   ,0xa31,false);
        this_00 = &((this->m_most_recent_block_txs)._M_t.
                    super___uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                    .
                    super__Head_base<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                   ._M_head_impl)->_M_t;
        if ((this_00 ==
             (_Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
              *)0x0) ||
           (cVar12 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                     ::find(this_00,(key_type *)auStack_1e7),
           cVar12._M_node ==
           (_Base_ptr)
           ((long)&(((this->m_most_recent_block_txs)._M_t.
                     super___uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                    ._M_head_impl)->_M_t)._M_impl + 8U))) {
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&block_data);
          tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     (cVar12._M_node + 2));
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&block_data);
        }
      }
      else {
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
        txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::vector<CInv,_std::allocator<CInv>_>::push_back(&vNotFound,(value_type *)peVar7);
      }
      else {
        maybe_with_witness.allow_witness =
             *(int *)&(peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start != 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"tx",(allocator<char> *)&block_data);
        txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&maybe_with_witness;
        txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pPVar19 = this;
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                  ((PeerManagerImpl *)this,pfrom,&local_248,
                   (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&txinfo);
        std::__cxx11::string::~string((string *)&local_248);
        CTxMemPool::RemoveUnbroadcastTx
                  (this->m_mempool,
                   &((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped,false);
        this = pPVar19;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
  }
  pPVar19 = this;
  if ((local_318._M_cur ==
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur) || (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0))
  goto LAB_001b09ee;
  std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator++((_Self *)&txinfo,&local_318,0);
  peVar7 = txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar8 = CInv::IsGenBlkMsg((CInv *)txinfo.tx.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
  pPVar19 = this;
  if (!bVar8) goto LAB_001b09ee;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&txinfo,mutexIn,"m_most_recent_block_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x983,false);
  pPVar19 = this;
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
             &(this->m_most_recent_block).
              super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>,
             &(this->m_most_recent_compact_block).
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&txinfo);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&txinfo,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x98a,false);
  mutexIn = (Mutex *)((long)&(peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                             .super__Vector_impl_data._M_start + 4);
  pCVar13 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,(uint256 *)mutexIn)
  ;
  if ((pCVar13 == (CBlockIndex *)0x0) || (pCVar13->m_chain_tx_count == 0)) {
LAB_001afd70:
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&txinfo);
  }
  else {
    uVar2 = pCVar13->nStatus;
    if ((uVar2 & 0x60) == 0 && 4 < (uVar2 & 7)) goto LAB_001afd70;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&txinfo);
    if ((uVar2 & 0x60) == 0 && 1 < (uVar2 & 7)) {
      txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&txinfo.fee;
      txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      txinfo.m_time.__r = 0;
      _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      txinfo.fee._0_1_ = 0;
      txinfo.nFeeDelta = (int64_t)local_f8;
      local_f8[0]._M_local_buf[0] = '\0';
      pCVar14 = ChainstateManager::ActiveChainstate(pPVar19->m_chainman);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_2a8,
                 &a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
      pTVar18 = &txinfo;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var15._M_pi;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2a8;
      bVar8 = Chainstate::ActivateBestChain(pCVar14,(BlockValidationState *)pTVar18,pblock_00);
      LVar16 = (Level)pTVar18;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a8 + 8));
      if ((!bVar8) && (bVar8 = ::LogAcceptCategory(NET,LVar16), bVar8)) {
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((string *)&maybe_with_witness,(ValidationState<BlockValidationResult> *)&txinfo);
        logging_function_01._M_str = "ProcessGetBlockData";
        logging_function_01._M_len = 0x13;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x62;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,0x99b,NET,Debug,
                   (ConstevalFormatString<1U>)0x68a3db,(string *)&maybe_with_witness);
        std::__cxx11::string::~string((string *)&maybe_with_witness);
      }
      ValidationState<BlockValidationResult>::~ValidationState
                ((ValidationState<BlockValidationResult> *)&txinfo);
    }
  }
  local_2b0.nFile = -1;
  local_2b0.nPos = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&txinfo,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x9a4,false);
  pCVar13 = ::node::BlockManager::LookupBlockIndex
                      (&pPVar19->m_chainman->m_blockman,(uint256 *)mutexIn);
  if (pCVar13 == (CBlockIndex *)0x0) {
LAB_001aff0d:
    bVar8 = false;
    bVar9 = false;
    in_stack_fffffffffffffc68 = (CBlockIndex *)0x0;
  }
  else {
    pCVar17 = pCVar13;
    bVar8 = BlockRequestAllowed(pPVar19,pCVar13);
    if (!bVar8) {
      bVar8 = ::LogAcceptCategory(NET,(Level)pCVar17);
      if (bVar8) {
        _maybe_with_witness = (TransactionSerParams *)pfrom->id;
        logging_function_00._M_str = "ProcessGetBlockData";
        logging_function_00._M_len = 0x13;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x62;
        LogPrintFormatInternal<char[20],long>
                  (logging_function_00,source_file_00,0x9aa,NET,Debug,
                   (ConstevalFormatString<2U>)0x68b1ff,(char (*) [20])"ProcessGetBlockData",
                   (long *)&maybe_with_witness);
      }
      goto LAB_001aff0d;
    }
    LVar16 = Debug;
    bVar8 = CConnman::OutboundTargetReached(pPVar19->m_connman,true);
    if ((bVar8) &&
       ((((pCVar17 = pPVar19->m_chainman->m_best_header, pCVar17 != (CBlockIndex *)0x0 &&
          (0x93a80 < (long)((ulong)pCVar17->nTime - (ulong)pCVar13->nTime))) ||
         (*(int *)&(peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start == 3)) &&
        ((pfrom->m_permission_flags & Download) == None)))) {
      bVar8 = ::LogAcceptCategory(NET,LVar16);
      if (bVar8) {
        _maybe_with_witness = (TransactionSerParams *)pfrom->id;
        logging_function._M_str = "ProcessGetBlockData";
        logging_function._M_len = 0x13;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x62;
        LogPrintFormatInternal<long>
                  (logging_function,source_file,0x9b2,NET,Debug,(ConstevalFormatString<1U>)0x68b24d,
                   (long *)&maybe_with_witness);
      }
      LOCK();
      (pfrom->fDisconnect)._M_base._M_i = true;
      UNLOCK();
      goto LAB_001aff0d;
    }
    pCVar14 = ChainstateManager::ActiveChainstate(pPVar19->m_chainman);
    ppCVar5 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      in_stack_fffffffffffffc68 = (CBlockIndex *)0x0;
    }
    else {
      in_stack_fffffffffffffc68 = ppCVar5[-1];
    }
    if ((((~pfrom->m_permission_flags & 0x50) == 0) ||
        ((peer->m_our_services & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NETWORK_LIMITED)) ||
       (in_stack_fffffffffffffc68->nHeight - pCVar13->nHeight < 0x123)) {
      if ((pCVar13->nStatus & 8) == 0) goto LAB_001b029a;
      bVar9 = CanDirectFetch(pPVar19);
      local_2b0 = CBlockIndex::GetBlockPos(pCVar13);
      bVar8 = true;
    }
    else {
      bVar8 = ::LogAcceptCategory(NET,LVar16);
      if (bVar8) {
        _maybe_with_witness = (TransactionSerParams *)pfrom->id;
        logging_function_02._M_str = "ProcessGetBlockData";
        logging_function_02._M_len = 0x13;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_02._M_len = 0x62;
        LogPrintFormatInternal<long>
                  (logging_function_02,source_file_02,0x9bb,NET,Debug,
                   (ConstevalFormatString<1U>)0x68b289,(long *)&maybe_with_witness);
      }
      LOCK();
      (pfrom->fDisconnect)._M_base._M_i = true;
      UNLOCK();
LAB_001b029a:
      bVar8 = false;
      bVar9 = false;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&txinfo)
  ;
  if (bVar8) {
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
LAB_001aff96:
      if (*(int *)&(peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x40000002) {
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar8 = ::node::BlockManager::ReadRawBlockFromDisk
                          (&pPVar19->m_chainman->m_blockman,&block_data,&local_2b0);
        if (bVar8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tx,"block",(allocator<char> *)&local_228);
          local_208.m_data =
               block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_208.m_size =
               (size_t)(block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                       -(long)block_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          pCVar6 = pPVar19->m_connman;
          _maybe_with_witness = (TransactionSerParams *)local_1d8;
          if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)local_68) {
            local_1d8[0]._8_8_ = local_68._8_8_;
          }
          else {
            _maybe_with_witness =
                 (TransactionSerParams *)
                 tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          local_1d8[0]._1_7_ = local_68._1_7_;
          local_1d8[0]._0_1_ = local_68[0];
          local_1e0._M_pi =
               tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_68[0] = 0;
          msg_type._M_string_length = (size_type)pfrom;
          msg_type._M_dataplus._M_p = (pointer)pPVar19;
          msg_type.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc68;
          msg_type.field_2._8_8_ = peer;
          tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_68;
          NetMsg::Make<Span<unsigned_char>>
                    ((CSerializedNetMsg *)&txinfo,(NetMsg *)&maybe_with_witness,msg_type,&local_208)
          ;
          CConnman::PushMessage(pCVar6,pfrom,(CSerializedNetMsg *)&txinfo);
          CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)&txinfo);
          std::__cxx11::string::~string((string *)&maybe_with_witness);
          std::__cxx11::string::~string((string *)&tx);
        }
        else {
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&txinfo,&cs_main,
                     "m_chainman.GetMutex()",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                     ,0x9d1,false);
          pCVar17 = pCVar13;
          bVar10 = ::node::BlockManager::IsBlockPruned(&pPVar19->m_chainman->m_blockman,pCVar13);
          LVar16 = (Level)pCVar17;
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&txinfo);
          if (bVar10) {
            bVar10 = ::LogAcceptCategory(NET,LVar16);
            if (bVar10) {
              txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)pfrom->id;
              logging_function_03._M_str = "ProcessGetBlockData";
              logging_function_03._M_len = 0x13;
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_03._M_len = 0x62;
              LogPrintFormatInternal<long>
                        (logging_function_03,source_file_03,0x9d2,NET,Debug,
                         (ConstevalFormatString<1U>)0x68b2d8,(long *)&txinfo);
            }
          }
          else {
            txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pfrom->id;
            logging_function_05._M_str = "ProcessGetBlockData";
            logging_function_05._M_len = 0x13;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_05._M_len = 0x62;
            LogPrintFormatInternal<long>
                      (logging_function_05,source_file_05,0x9d4,ALL,Error,
                       (ConstevalFormatString<1U>)0x68b316,(long *)&txinfo);
          }
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      else {
        std::make_shared<CBlock>();
        bVar8 = ::node::BlockManager::ReadBlockFromDisk
                          (&pPVar19->m_chainman->m_blockman,(CBlock *)_maybe_with_witness,&local_2b0
                          );
        if (bVar8) {
          std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&pblock,
                     (__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *)&maybe_with_witness);
        }
        else {
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&txinfo,&cs_main,
                     "m_chainman.GetMutex()",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                     ,0x9df,false);
          pCVar17 = pCVar13;
          bVar10 = ::node::BlockManager::IsBlockPruned(&pPVar19->m_chainman->m_blockman,pCVar13);
          LVar16 = (Level)pCVar17;
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&txinfo);
          if (bVar10) {
            bVar10 = ::LogAcceptCategory(NET,LVar16);
            if (bVar10) {
              txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)pfrom->id;
              logging_function_04._M_str = "ProcessGetBlockData";
              logging_function_04._M_len = 0x13;
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_04._M_len = 0x62;
              LogPrintFormatInternal<long>
                        (logging_function_04,source_file_04,0x9e0,NET,Debug,
                         (ConstevalFormatString<1U>)0x68b2d8,(long *)&txinfo);
            }
          }
          else {
            txinfo.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pfrom->id;
            logging_function_06._M_str = "ProcessGetBlockData";
            logging_function_06._M_len = 0x13;
            source_file_06._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_06._M_len = 0x62;
            LogPrintFormatInternal<long>
                      (logging_function_06,source_file_06,0x9e2,ALL,Error,
                       (ConstevalFormatString<1U>)0x68b316,(long *)&txinfo);
          }
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
      }
      this_01 = peer;
      if (bVar8 != false) goto LAB_001b05a3;
    }
    else {
      CBlockHeader::GetHash
                ((uint256 *)&txinfo,
                 &(a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CBlockHeader);
      CBlockIndex::GetBlockHash((uint256 *)&maybe_with_witness,pCVar13);
      bVar8 = ::operator==((base_blob<256U> *)&txinfo,(base_blob<256U> *)&maybe_with_witness);
      if (!bVar8) goto LAB_001aff96;
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
                 &a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
      this_01 = peer;
LAB_001b05a3:
      if (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        iVar3 = *(int *)&(peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start;
        if (iVar3 == 0x40000002) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txinfo,"block",(allocator<char> *)&block_data);
          _maybe_with_witness = &::TX_WITH_WITNESS;
          local_1e0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((PeerManagerImpl *)pPVar19,pfrom,(string *)&txinfo,
                     (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
          goto LAB_001b07e9;
        }
        if (iVar3 == 3) {
          CMerkleBlock::CMerkleBlock((CMerkleBlock *)&txinfo);
          pTVar11 = Peer::GetTxRelay(this_01);
          if (pTVar11 != (TxRelay *)0x0) {
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&block_data,
                       &pTVar11->m_bloom_filter_mutex,"tx_relay->m_bloom_filter_mutex",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                       ,0x9f2,false);
            filter = (pTVar11->m_bloom_filter)._M_t.
                     super___uniq_ptr_impl<CBloomFilter,_std::default_delete<CBloomFilter>_>._M_t.
                     super__Tuple_impl<0UL,_CBloomFilter_*,_std::default_delete<CBloomFilter>_>.
                     super__Head_base<0UL,_CBloomFilter_*,_false>._M_head_impl;
            if (filter == (CBloomFilter *)0x0) {
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&block_data);
            }
            else {
              CMerkleBlock::CMerkleBlock
                        ((CMerkleBlock *)&maybe_with_witness,
                         pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         filter);
              CMerkleBlock::operator=((CMerkleBlock *)&txinfo,(CMerkleBlock *)&maybe_with_witness);
              CMerkleBlock::~CMerkleBlock((CMerkleBlock *)&maybe_with_witness);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&block_data);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_208,"merkleblock",(allocator<char> *)&local_228);
              pCVar6 = pPVar19->m_connman;
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&block_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              if (local_208.m_data != &local_1f8) {
                block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start = local_208.m_data;
              }
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_1f7,local_1f8);
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_208.m_size;
              local_208.m_size = 0;
              local_1f8 = '\0';
              msg_type_00._M_string_length = (size_type)pfrom;
              msg_type_00._M_dataplus._M_p = (pointer)pPVar19;
              msg_type_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc68;
              msg_type_00.field_2._8_8_ = this_01;
              local_208.m_data = &local_1f8;
              NetMsg::Make<CMerkleBlock&>
                        ((CSerializedNetMsg *)&maybe_with_witness,(NetMsg *)&block_data,msg_type_00,
                         (CMerkleBlock *)&txinfo);
              CConnman::PushMessage(pCVar6,pfrom,(CSerializedNetMsg *)&maybe_with_witness);
              CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)&maybe_with_witness);
              std::__cxx11::string::~string((string *)&block_data);
              std::__cxx11::string::~string((string *)&local_208);
              for (; local_90 != local_88; local_90 = local_90 + 1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&maybe_with_witness,"tx",(allocator<char> *)&local_228);
                block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     (pointer)((pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->vtx).
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_90->first].
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start = "";
                (anonymous_namespace)::PeerManagerImpl::
                MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                          ((PeerManagerImpl *)pPVar19,pfrom,(string *)&maybe_with_witness,
                           (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&block_data);
                std::__cxx11::string::~string((string *)&maybe_with_witness);
              }
            }
          }
          CMerkleBlock::~CMerkleBlock((CMerkleBlock *)&txinfo);
        }
        else if (iVar3 == 4) {
          if ((bVar9 == false) || (pCVar13->nHeight < in_stack_fffffffffffffc68->nHeight + -5)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&txinfo,"block",(allocator<char> *)&block_data);
            _maybe_with_witness = &::TX_WITH_WITNESS;
            local_1e0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                      ((PeerManagerImpl *)pPVar19,pfrom,(string *)&txinfo,
                       (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
            goto LAB_001b07e9;
          }
          if (a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            CBlockHeader::GetHash
                      ((uint256 *)&txinfo,
                       &(a_recent_compact_block.
                         super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->header);
            CBlockIndex::GetBlockHash((uint256 *)&maybe_with_witness,pCVar13);
            bVar8 = ::operator==((base_blob<256U> *)&txinfo,(base_blob<256U> *)&maybe_with_witness);
            if (bVar8) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&block_data,"cmpctblock",(allocator<char> *)&local_208);
              pCVar6 = pPVar19->m_connman;
              _maybe_with_witness = (TransactionSerParams *)local_1d8;
              ppuVar1 = &block_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              if ((pointer *)
                  block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == ppuVar1) {
                local_1d8[0]._8_8_ = pCStack_40;
              }
              else {
                _maybe_with_witness =
                     (TransactionSerParams *)
                     block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              local_1d8[0]._M_allocated_capacity =
                   block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1e0._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)block_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              msg_type_01._M_string_length = (size_type)pfrom;
              msg_type_01._M_dataplus._M_p = (pointer)pPVar19;
              msg_type_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc68;
              msg_type_01.field_2._8_8_ = this_01;
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppuVar1;
              NetMsg::Make<CBlockHeaderAndShortTxIDs_const&>
                        ((CSerializedNetMsg *)&txinfo,(NetMsg *)&maybe_with_witness,msg_type_01,
                         a_recent_compact_block.
                         super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              CConnman::PushMessage(pCVar6,pfrom,(CSerializedNetMsg *)&txinfo);
              CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)&txinfo);
              std::__cxx11::string::~string((string *)&maybe_with_witness);
              pTVar18 = (TxMempoolInfo *)&block_data;
              goto LAB_001b07f1;
            }
          }
          block = pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          nonce = FastRandomContext::rand64(&pPVar19->m_rng);
          CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
                    ((CBlockHeaderAndShortTxIDs *)&txinfo,block,nonce);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&maybe_with_witness,"cmpctblock",(allocator<char> *)&block_data);
          (anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<CBlockHeaderAndShortTxIDs&>
                    ((PeerManagerImpl *)pPVar19,pfrom,(string *)&maybe_with_witness,
                     (CBlockHeaderAndShortTxIDs *)&txinfo);
          std::__cxx11::string::~string((string *)&maybe_with_witness);
          CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
                    ((CBlockHeaderAndShortTxIDs *)&txinfo);
        }
        else if (iVar3 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txinfo,"block",(allocator<char> *)&block_data);
          _maybe_with_witness = &::TX_NO_WITNESS;
          local_1e0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((PeerManagerImpl *)pPVar19,pfrom,(string *)&txinfo,
                     (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
LAB_001b07e9:
          pTVar18 = &txinfo;
LAB_001b07f1:
          std::__cxx11::string::~string((string *)pTVar18);
        }
      }
      peer = this_01;
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (&criticalblock57,&this_01->m_block_inv_mutex,"peer.m_block_inv_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                 ,0xa19,false);
      bVar8 = ::operator==((base_blob<256U> *)mutexIn,
                           &(this_01->m_continuation_block).super_base_blob<256U>);
      if (bVar8) {
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2ec = MSG_BLOCK;
        CBlockIndex::GetBlockHash((uint256 *)&local_228,in_stack_fffffffffffffc68);
        std::vector<CInv,std::allocator<CInv>>::emplace_back<GetDataMsg,uint256>
                  ((vector<CInv,std::allocator<CInv>> *)&vInv,&local_2ec,(uint256 *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"inv",(allocator<char> *)&local_2ec);
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                  ((PeerManagerImpl *)pPVar19,pfrom,&local_228,&vInv);
        std::__cxx11::string::~string((string *)&local_228);
        base_blob<256U>::SetNull(&(this_01->m_continuation_block).super_base_blob<256U>);
        std::_Vector_base<CInv,_std::allocator<CInv>_>::~_Vector_base
                  (&vInv.super__Vector_base<CInv,_std::allocator<CInv>_>);
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock57.super_unique_lock);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_001b09ee:
  __first._M_first = (_Elt_pointer)pfrom;
  __first._M_cur = (_Elt_pointer)pPVar19;
  __first._M_last = (_Elt_pointer)in_stack_fffffffffffffc68;
  __first._M_node = (_Map_pointer)peer;
  __last._M_first = (_Elt_pointer)this_02;
  __last._M_cur = (_Elt_pointer)mutexIn;
  __last._M_last = local_318._M_cur;
  __last._M_node = (_Map_pointer)local_318._M_first;
  std::deque<CInv,_std::allocator<CInv>_>::erase((iterator *)&txinfo,this_02,__first,__last);
  if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"notfound",(allocator<char> *)&txinfo);
    (anonymous_namespace)::PeerManagerImpl::
    MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
              ((PeerManagerImpl *)pPVar19,pfrom,&local_268,&vNotFound);
    std::__cxx11::string::~string((string *)&local_268);
  }
LAB_001b0a8b:
  std::_Vector_base<CInv,_std::allocator<CInv>_>::~_Vector_base
            (&vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetData(CNode& pfrom, Peer& peer, const std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(cs_main);

    auto tx_relay = peer.GetTxRelay();

    std::deque<CInv>::iterator it = peer.m_getdata_requests.begin();
    std::vector<CInv> vNotFound;

    // Process as many TX items from the front of the getdata queue as
    // possible, since they're common and it's efficient to batch process
    // them.
    while (it != peer.m_getdata_requests.end() && it->IsGenTxMsg()) {
        if (interruptMsgProc) return;
        // The send buffer provides backpressure. If there's no space in
        // the buffer, pause processing until the next call.
        if (pfrom.fPauseSend) break;

        const CInv &inv = *it++;

        if (tx_relay == nullptr) {
            // Ignore GETDATA requests for transactions from block-relay-only
            // peers and peers that asked us not to announce transactions.
            continue;
        }

        CTransactionRef tx = FindTxForGetData(*tx_relay, ToGenTxid(inv));
        if (tx) {
            // WTX and WITNESS_TX imply we serialize with witness
            const auto maybe_with_witness = (inv.IsMsgTx() ? TX_NO_WITNESS : TX_WITH_WITNESS);
            MakeAndPushMessage(pfrom, NetMsgType::TX, maybe_with_witness(*tx));
            m_mempool.RemoveUnbroadcastTx(tx->GetHash());
        } else {
            vNotFound.push_back(inv);
        }
    }

    // Only process one BLOCK item per call, since they're uncommon and can be
    // expensive to process.
    if (it != peer.m_getdata_requests.end() && !pfrom.fPauseSend) {
        const CInv &inv = *it++;
        if (inv.IsGenBlkMsg()) {
            ProcessGetBlockData(pfrom, peer, inv);
        }
        // else: If the first item on the queue is an unknown type, we erase it
        // and continue processing the queue on the next call.
    }

    peer.m_getdata_requests.erase(peer.m_getdata_requests.begin(), it);

    if (!vNotFound.empty()) {
        // Let the peer know that we didn't find what it asked for, so it doesn't
        // have to wait around forever.
        // SPV clients care about this message: it's needed when they are
        // recursively walking the dependencies of relevant unconfirmed
        // transactions. SPV clients want to do that because they want to know
        // about (and store and rebroadcast and risk analyze) the dependencies
        // of transactions relevant to them, without having to download the
        // entire memory pool.
        // Also, other nodes can use these messages to automatically request a
        // transaction from some other peer that announced it, and stop
        // waiting for us to respond.
        // In normal operation, we often send NOTFOUND messages for parents of
        // transactions that we relay; if a peer is missing a parent, they may
        // assume we have them and request the parents from us.
        MakeAndPushMessage(pfrom, NetMsgType::NOTFOUND, vNotFound);
    }
}